

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

void crc32_init(crc32_t *crc,unsigned_long poly,unsigned_long init,unsigned_long xor)

{
  ulong uVar1;
  unsigned_long bit;
  ulong uStack_38;
  int j;
  unsigned_long r;
  int i;
  unsigned_long xor_local;
  unsigned_long init_local;
  unsigned_long poly_local;
  crc32_t *crc_local;
  
  crc->poly = poly;
  crc->init = init;
  crc->xor = xor;
  for (r._4_4_ = 0; r._4_4_ < 0x100; r._4_4_ = r._4_4_ + 1) {
    uStack_38 = (long)r._4_4_ << 0x18;
    for (bit._4_4_ = 0; bit._4_4_ < 8; bit._4_4_ = bit._4_4_ + 1) {
      uVar1 = uStack_38 & 0xffffffff80000000;
      uStack_38 = uStack_38 << 1;
      if (uVar1 != 0) {
        uStack_38 = crc->poly ^ uStack_38;
      }
    }
    crc->table[r._4_4_] = uStack_38 & 0xffffffff;
  }
  return;
}

Assistant:

void crc32_init(crc32_t *crc, unsigned long poly,
                unsigned long init, unsigned long xor) {
  crc->poly = poly;
  crc->init = init;
  crc->xor = xor;

  int i;
  for (i = 0; i < 256; i++) {
    unsigned long r = (unsigned long)i;
    r <<= 24;

    int j;
    for (j = 0; j < 8; j++) {
      unsigned long bit = r & (1 << 31);
      r <<= 1;
      if (bit)
        r ^= crc->poly;
    }

    r &= 0xFFFFFFFF;
    crc->table[i] = r;
  }
}